

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

void __thiscall Json::StyledWriter::writeCommentAfterValueOnSameLine(StyledWriter *this,Value *root)

{
  long *plVar1;
  CommentInfo *pCVar2;
  size_type *psVar3;
  string *psVar4;
  string local_78;
  string local_58;
  string local_38;
  
  pCVar2 = root->comments_;
  if (pCVar2 != (CommentInfo *)0x0) {
    if (pCVar2[1].comment_ != (char *)0x0) {
      Value::getComment_abi_cxx11_(&local_38,root,commentAfterOnSameLine);
      normalizeEOL(&local_58,&local_38);
      plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x127ac9);
      psVar3 = (size_type *)(plVar1 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar1 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_78.field_2._M_allocated_capacity = *psVar3;
        local_78.field_2._8_8_ = plVar1[3];
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      }
      else {
        local_78.field_2._M_allocated_capacity = *psVar3;
        local_78._M_dataplus._M_p = (pointer)*plVar1;
      }
      local_78._M_string_length = plVar1[1];
      *plVar1 = (long)psVar3;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&this->document_,(ulong)local_78._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      pCVar2 = root->comments_;
      if (pCVar2 == (CommentInfo *)0x0) {
        return;
      }
    }
    if (pCVar2[2].comment_ != (char *)0x0) {
      psVar4 = &this->document_;
      std::__cxx11::string::append((char *)psVar4);
      Value::getComment_abi_cxx11_(&local_58,root,commentAfter);
      normalizeEOL(&local_78,&local_58);
      std::__cxx11::string::_M_append((char *)psVar4,(ulong)local_78._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)psVar4);
    }
  }
  return;
}

Assistant:

bool Value::hasComment(CommentPlacement placement) const {
  return comments_ != 0 && comments_[placement].comment_ != 0;
}